

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_keydata.cpp
# Opt level: O2

void __thiscall KeyData_Constructor_Test::TestBody(KeyData_Constructor_Test *this)

{
  byte bVar1;
  char *in_R9;
  AssertHelper local_1a0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  string local_190;
  AssertionResult gtest_ar_;
  KeyData empty_obj;
  
  cfd::core::KeyData::KeyData(&empty_obj);
  bVar1 = cfd::core::KeyData::IsValid();
  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1 != 0) {
    testing::Message::Message((Message *)&local_198);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_190,(internal *)&gtest_ar_,(AssertionResult *)"empty_obj.IsValid()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_keydata.cpp"
               ,0x18,local_190._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    std::__cxx11::string::~string((string *)&local_190);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_198);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  cfd::core::KeyData::~KeyData(&empty_obj);
  return;
}

Assistant:

TEST(KeyData, Constructor) {
  KeyData empty_obj;
  EXPECT_FALSE(empty_obj.IsValid());
}